

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unidim-lipm-dcm-estimator.cpp
# Opt level: O2

void __thiscall
stateObservation::UnidimLipmDcmEstimator::setUnbiasedDCM
          (UnidimLipmDcmEstimator *this,double dcm,double uncertainty)

{
  Matrix2 P;
  void *local_50 [3];
  double local_38 [5];
  
  setUnbiasedDCM(this,dcm);
  KalmanFilterBase::getStateCovariance((Pmatrix *)local_50,&(this->filter_).super_KalmanFilterBase);
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,2,0,2,2>>::
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PlainObjectBase<Eigen::Matrix<double,2,2,0,2,2>> *)local_38,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_50);
  free(local_50[0]);
  local_38[0] = uncertainty * uncertainty;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,2,2,0,2,2>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_50,
             (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_38);
  KalmanFilterBase::setStateCovariance(&(this->filter_).super_KalmanFilterBase,(Pmatrix *)local_50);
  free(local_50[0]);
  return;
}

Assistant:

void UnidimLipmDcmEstimator::setUnbiasedDCM(double dcm, double uncertainty)
{
  setUnbiasedDCM(dcm);
  Matrix2 P = filter_.getStateCovariance();
  /// resetting the non diagonal parts
  P(0, 1) = P(1, 0) = 0;
  P(0, 0) = square(uncertainty);
  filter_.setStateCovariance(P);
}